

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O2

int sys_trim(mstate m,size_t pad)

{
  ulong __old_len;
  char *__addr;
  int iVar1;
  ulong uVar2;
  msegmentptr pmVar3;
  size_t sVar4;
  malloc_segment *pmVar5;
  void *pvVar6;
  ulong uVar7;
  
  if (mparams.magic == 0) {
    init_mparams();
  }
  sVar4 = mparams.granularity;
  if (0xffffffffffffff7f < pad) {
    return 0;
  }
  if (m->top == (mchunkptr)0x0) {
    return 0;
  }
  if (pad + 0x50 < m->topsize) {
    uVar2 = ((m->topsize - pad) + -0x51 + mparams.granularity) / mparams.granularity;
    pmVar3 = segment_holding(m,(char *)m->top);
    uVar7 = 0;
    if ((pmVar3->sflags & 9) != 1) goto LAB_0013548c;
    __old_len = pmVar3->size;
    uVar2 = (uVar2 - 1) * sVar4;
    if (uVar2 <= __old_len) {
      __addr = pmVar3->base;
      pmVar5 = &m->seg;
      do {
        uVar7 = 0;
        if (__addr <= pmVar5 && pmVar5 < __addr + __old_len) goto LAB_0013548c;
        pmVar5 = pmVar5->next;
      } while (pmVar5 != (malloc_segment *)0x0);
      pvVar6 = mremap(__addr,__old_len,__old_len - uVar2,0);
      if (pvVar6 == (void *)0xffffffffffffffff) {
        iVar1 = munmap(pmVar3->base + (__old_len - uVar2),uVar2);
        uVar7 = 0;
        if ((uVar2 == 0) || (iVar1 != 0)) goto LAB_0013548c;
      }
      else if (uVar2 == 0) goto LAB_00135489;
      pmVar3->size = pmVar3->size - uVar2;
      m->footprint = m->footprint - uVar2;
      init_top(m,m->top,m->topsize - uVar2);
      uVar7 = uVar2;
      goto LAB_0013548c;
    }
  }
LAB_00135489:
  uVar7 = 0;
LAB_0013548c:
  sVar4 = release_unused_segments(m);
  if (sVar4 + uVar7 == 0) {
    iVar1 = 0;
    if (m->trim_check < m->topsize) {
      m->trim_check = 0xffffffffffffffff;
    }
  }
  else {
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int sys_trim(mstate m, size_t pad) {
  size_t released = 0;
  ensure_initialization();
  if (pad < MAX_REQUEST && is_initialized(m)) {
    pad += TOP_FOOT_SIZE; /* ensure enough room for segment overhead */

    if (m->topsize > pad) {
      /* Shrink top space in granularity-size units, keeping at least one */
      size_t unit = mparams.granularity;
      size_t extra = ((m->topsize - pad + (unit - SIZE_T_ONE)) / unit -
                      SIZE_T_ONE) * unit;
      msegmentptr sp = segment_holding(m, (char*)m->top);

      if (!is_extern_segment(sp)) {
        if (is_mmapped_segment(sp)) {
          if (HAVE_MMAP &&
              sp->size >= extra &&
              !has_segment_link(m, sp)) { /* can't shrink if pinned */
            size_t newsize = sp->size - extra;
            (void)newsize; /* placate people compiling -Wunused-variable */
            /* Prefer mremap, fall back to munmap */
            if ((CALL_MREMAP(sp->base, sp->size, newsize, 0) != MFAIL) ||
                (CALL_MUNMAP(sp->base + newsize, extra) == 0)) {
              released = extra;
            }
          }
        }
        else if (HAVE_MORECORE) {
          if (extra >= HALF_MAX_SIZE_T) /* Avoid wrapping negative */
            extra = (HALF_MAX_SIZE_T) + SIZE_T_ONE - unit;
          ACQUIRE_MALLOC_GLOBAL_LOCK();
          {
            /* Make sure end of memory is where we last set it. */
            char* old_br = (char*)(CALL_MORECORE(0));
            if (old_br == sp->base + sp->size) {
              char* rel_br = (char*)(CALL_MORECORE(-extra));
              char* new_br = (char*)(CALL_MORECORE(0));
              if (rel_br != CMFAIL && new_br < old_br)
                released = old_br - new_br;
            }
          }
          RELEASE_MALLOC_GLOBAL_LOCK();
        }
      }

      if (released != 0) {
        sp->size -= released;
        m->footprint -= released;
        init_top(m, m->top, m->topsize - released);
        check_top_chunk(m, m->top);
      }
    }

    /* Unmap any unused mmapped segments */
    if (HAVE_MMAP)
      released += release_unused_segments(m);

    /* On failure, disable autotrim to avoid repeated failed future calls */
    if (released == 0 && m->topsize > m->trim_check)
      m->trim_check = MAX_SIZE_T;
  }

  return (released != 0)? 1 : 0;
}